

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void tooltip_timeout(void *param_1)

{
  int iVar1;
  Fl_Window *pFVar2;
  Fl_TooltipBox *this;
  int condition;
  void *param_0_local;
  
  if (recursion == '\0') {
    recursion = '\x01';
    iVar1 = top_win_iconified_();
    if (iVar1 == 0) {
      if ((tip == (char *)0x0) || (*tip == '\0')) {
        if (window != (Fl_TooltipBox *)0x0) {
          (*(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[6])();
        }
      }
      else {
        pFVar2 = Fl::grab();
        if (pFVar2 == (Fl_Window *)0x0) {
          if (window == (Fl_TooltipBox *)0x0) {
            this = (Fl_TooltipBox *)operator_new(0xf0);
            Fl_TooltipBox::Fl_TooltipBox(this);
            window = this;
          }
          Fl_Widget::label((Fl_Widget *)window,tip);
          Fl_TooltipBox::layout(window);
          Fl_Widget::redraw((Fl_Widget *)window);
          (*(window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget._vptr_Fl_Widget[5])();
        }
      }
    }
    Fl::remove_timeout(recent_timeout,(void *)0x0);
    recent_tooltip = '\x01';
    recursion = '\0';
  }
  return;
}

Assistant:

static void tooltip_timeout(void*) {
#ifdef DEBUG
  puts("tooltip_timeout();");
#endif // DEBUG

  if (recursion) return;
  recursion = 1;
  if (!top_win_iconified_()) {   // no tooltip if top win iconified (STR #3157)
    if (!tip || !*tip) {
      if (window) window->hide();
    } else {
      int condition = 1;
#if !(defined(__APPLE__) || defined(WIN32))
      condition = (Fl::grab() == NULL);
#endif
      if ( condition ) {
	if (!window) window = new Fl_TooltipBox;
	// this cast bypasses the normal Fl_Window label() code:
	((Fl_Widget*)window)->label(tip);
	window->layout();
	window->redraw();
	// printf("tooltip_timeout: Showing window %p with tooltip \"%s\"...\n",
	//        window, tip ? tip : "(null)");
	window->show();
      }
    }
  }

  Fl::remove_timeout(recent_timeout);
  recent_tooltip = 1;
  recursion = 0;
}